

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

void __thiscall CEDate::CEDate(CEDate *this,vector<double,_std::allocator<double>_> *date)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double *in_stack_00000068;
  CEDate *in_stack_00000070;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  CEDate *in_stack_ffffffffffffffe0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe8;
  
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__CEDate_001527f0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x135d85);
  *(undefined4 *)
   &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  init_members(in_stack_ffffffffffffffe0);
  std::vector<double,_std::allocator<double>_>::vector(in_RSI,in_stack_ffffffffffffffe8);
  GregorianVect2Gregorian(in_stack_ffffffffffffffc0);
  SetDate(in_stack_00000070,in_stack_00000068,(CEDateType *)this);
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  return;
}

Assistant:

CEDate::CEDate(std::vector<double> date)
{
    init_members();
    // First get the gregorian date double from the vector, then set the date
    CEDate::SetDate(GregorianVect2Gregorian(date), CEDateType::GREGORIAN) ;
}